

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseLocationRange __thiscall
google::protobuf::TextFormat::ParseInfoTree::GetLocationRange
          (ParseInfoTree *this,FieldDescriptor *field,int index)

{
  int iVar1;
  _Base_ptr p_Var2;
  ParseLocation PVar3;
  long lVar4;
  ParseLocation PVar5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ParseLocationRange PVar8;
  
  CheckFieldIndex(field,index);
  p_Var7 = &(this->locations_)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var7->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(FieldDescriptor **)(p_Var6 + 1) < field]) {
    if (*(FieldDescriptor **)(p_Var6 + 1) >= field) {
      p_Var2 = p_Var6;
    }
  }
  p_Var6 = &p_Var7->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var7) &&
     (p_Var6 = p_Var2, field < *(FieldDescriptor **)(p_Var2 + 1))) {
    p_Var6 = &p_Var7->_M_header;
  }
  PVar5.line = -1;
  PVar5.column = -1;
  if ((_Rb_tree_header *)p_Var6 == p_Var7) {
    PVar3.line = -1;
    PVar3.column = -1;
  }
  else {
    iVar1 = 0;
    if (index != -1) {
      iVar1 = index;
    }
    lVar4 = (long)iVar1;
    p_Var2 = p_Var6[1]._M_parent;
    PVar3.line = -1;
    PVar3.column = -1;
    if (lVar4 < (long)p_Var6[1]._M_left - (long)p_Var2 >> 4) {
      PVar3 = *(ParseLocation *)(&p_Var2->_M_color + lVar4 * 4);
      PVar5 = *(ParseLocation *)(&p_Var2->_M_parent + lVar4 * 2);
    }
  }
  PVar8.end = PVar5;
  PVar8.start = PVar3;
  return PVar8;
}

Assistant:

TextFormat::ParseLocationRange TextFormat::ParseInfoTree::GetLocationRange(
    const FieldDescriptor* field, int index) const {
  CheckFieldIndex(field, index);
  if (index == -1) {
    index = 0;
  }

  const std::vector<TextFormat::ParseLocationRange>* locations =
      FindOrNull(locations_, field);
  if (locations == nullptr ||
      index >= static_cast<int64_t>(locations->size())) {
    return TextFormat::ParseLocationRange();
  }

  return (*locations)[index];
}